

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidatesWithScores
          (vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  pointer *this_00;
  double dVar1;
  wchar_t *pwVar2;
  undefined8 uVar3;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>
  local_b0;
  undefined1 local_88 [8];
  TWords words;
  wstring word;
  TScoredWords scoredCandidates;
  
  std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::wstring_const*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,void>
            ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)local_88,
             (sentence->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (sentence->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_b0);
  GetCandidatesRawWithScores
            ((TScoredWords *)((long)&word.field_2 + 8),this,(TWords *)local_88,position);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  for (uVar3 = word.field_2._8_8_;
      (pointer)uVar3 !=
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start; uVar3 = uVar3 + 0x18) {
    pwVar2 = (((pointer)uVar3)->Word).Ptr;
    dVar1 = ((pointer)uVar3)->Score;
    words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&word._M_string_length;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)this_00,pwVar2,pwVar2 + (((pointer)uVar3)->Word).Len);
    std::__cxx11::wstring::wstring((wstring *)&local_b0,(wstring *)this_00);
    local_b0.second = dVar1;
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::pair<std::__cxx11::wstring,double>>
              ((vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
                *)__return_storage_ptr__,&local_b0);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    std::__cxx11::wstring::~wstring((wstring *)this_00);
  }
  std::_Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::~_Vector_base
            ((_Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
             ((long)&word.field_2 + 8));
  std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
            ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::wstring,double> > TSpellCorrector::GetCandidatesWithScores(
    const std::vector<std::wstring>& sentence,
    size_t position
) const {

    TWords words(sentence.begin(), sentence.end());
    TScoredWords scoredCandidates = GetCandidatesRawWithScores(words, position);

    std::vector<std::pair<std::wstring,double> > results;
    for (auto s: scoredCandidates) {
        std::wstring word = std::wstring(s.Word.Ptr, s.Word.Len);
        results.push_back(std::make_pair(word, s.Score));
    }
    return results;
}